

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack-opts.cpp
# Opt level: O2

void __thiscall wasm::StackIROptimizer::run(StackIROptimizer *this)

{
  dce(this);
  if ((2 < this->passOptions->optimizeLevel) || (0 < this->passOptions->shrinkLevel)) {
    local2Stack(this);
  }
  removeUnneededBlocks(this);
  dce(this);
  vacuum(this);
  return;
}

Assistant:

void StackIROptimizer::run() {
  dce();
  // FIXME: local2Stack is currently rather slow (due to localGraph),
  //        so for now run it only when really optimizing
  if (passOptions.optimizeLevel >= 3 || passOptions.shrinkLevel >= 1) {
    local2Stack();
  }
  removeUnneededBlocks();
  dce();
  vacuum();
}